

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O0

void __thiscall picobench::runner::runner(runner *this,bool local)

{
  initializer_list<int> __l;
  registry *prVar1;
  allocator<int> local_49;
  int local_48 [8];
  iterator local_28;
  size_type local_20;
  byte local_11;
  runner *prStack_10;
  bool local_local;
  runner *this_local;
  
  local_11 = local;
  prStack_10 = this;
  registry::registry(&this->super_registry);
  this->_error = no_error;
  this->_should_run = true;
  this->_compare_results_across_samples = false;
  this->_compare_results_across_benchmarks = false;
  this->_output_format = text;
  this->_output_file = (char *)0x0;
  this->_stdout = (ostream *)&std::cout;
  this->_stderr = (ostream *)&std::cerr;
  this->_stdwarn = (ostream *)&std::cout;
  local_48[0] = 8;
  local_48[1] = 0x40;
  local_48[2] = 0x200;
  local_48[3] = 0x1000;
  local_48[4] = 0x2000;
  local_28 = local_48;
  local_20 = 5;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&this->_default_state_iterations,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  this->_default_samples = 2;
  picostring::picostring(&this->_cmd_prefix);
  this->_has_opts = false;
  std::
  vector<picobench::runner::cmd_line_option,_std::allocator<picobench::runner::cmd_line_option>_>::
  vector(&this->_opts);
  if ((local_11 & 1) == 0) {
    prVar1 = g_registry();
    std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::operator=
              (&(this->super_registry)._suites,&prVar1->_suites);
  }
  return;
}

Assistant:

runner(bool local = false)
        : _default_state_iterations(PICOBENCH_DEFAULT_ITERATIONS)
        , _default_samples(PICOBENCH_DEFAULT_SAMPLES)
    {
        if (!local)
        {
            _suites = std::move(g_registry()._suites);
        }
    }